

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_value.h
# Opt level: O0

char * docopt::value::kindAsString(Kind kind)

{
  Kind kind_local;
  char *local_8;
  
  switch(kind) {
  case Empty:
    local_8 = "empty";
    break;
  case Bool:
    local_8 = "bool";
    break;
  case Long:
    local_8 = "long";
    break;
  case String:
    local_8 = "string";
    break;
  case StringList:
    local_8 = "string-list";
    break;
  default:
    local_8 = "unknown";
  }
  return local_8;
}

Assistant:

static const char* kindAsString(Kind kind) {
			switch (kind) {
				case Kind::Empty: return "empty";
				case Kind::Bool: return "bool";
				case Kind::Long: return "long";
				case Kind::String: return "string";
				case Kind::StringList: return "string-list";
			}
			return "unknown";
		}